

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O2

LPVOID HeapReAlloc(HANDLE hHeap,DWORD dwFlags,LPVOID lpmem,SIZE_T numberOfBytes)

{
  LPVOID pvVar1;
  DWORD dwErrCode;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001306d2;
  if (hHeap == (HANDLE)0x1020304) {
    if (dwFlags != 0) {
      fprintf(_stderr,"] %s %s:%d","HeapReAlloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
              ,0x178);
      fprintf(_stderr,"Invalid parameter dwFlags=%#x\n",dwFlags);
      dwErrCode = 0x57;
      goto LAB_0013068f;
    }
    if (lpmem == (LPVOID)0x0) {
      dwErrCode = 0;
      goto LAB_0013068f;
    }
    pvVar1 = PAL_realloc(lpmem,numberOfBytes + (numberOfBytes == 0));
    if (pvVar1 == (void *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306d2;
      dwErrCode = 8;
      goto LAB_0013068f;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","HeapReAlloc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
            ,0x171);
    fprintf(_stderr,"Invalid heap handle\n");
    dwErrCode = 6;
LAB_0013068f:
    SetLastError(dwErrCode);
    pvVar1 = (LPVOID)0x0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return pvVar1;
  }
LAB_001306d2:
  abort();
}

Assistant:

LPVOID
PALAPI
HeapReAlloc(
    IN HANDLE hHeap,
    IN DWORD dwFlags,
    IN LPVOID lpmem,
    IN SIZE_T numberOfBytes)
{
    BYTE *pMem = NULL;

    PERF_ENTRY(HeapReAlloc);
    ENTRY("HeapReAlloc (hHeap=%p, dwFlags=%#x, lpmem=%p, numberOfBytes=%u)\n",
          hHeap, dwFlags, lpmem, numberOfBytes);

#ifdef __APPLE__
    if (hHeap == NULL)
#else // __APPLE__
    if (hHeap != (HANDLE)DUMMY_HEAP)
#endif // __APPLE__ else
    {
        ASSERT("Invalid heap handle\n");
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }

    if ((dwFlags != 0))
    {
        ASSERT("Invalid parameter dwFlags=%#x\n", dwFlags);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (lpmem == NULL)
    {
        WARN("NULL memory pointer to realloc. Do not do anything.\n");
        /* set LastError back to zero. this appears to be an undocumented
        behavior in Windows, in doesn't cost much to match it */
        SetLastError(0);
        goto done;
    }

    if(numberOfBytes == 0)
    {
        // PAL's realloc behaves like free for a requested size of zero bytes. Force a nonzero size to get a valid pointer.
        numberOfBytes = 1;
    }

#ifdef __APPLE__
    // This is patterned off of InternalRealloc in malloc.cpp.
    {
        pMem = (BYTE *) malloc_zone_realloc((malloc_zone_t *)hHeap, lpmem, numberOfBytes);
    }
#else // __APPLE__
    pMem = (BYTE *) PAL_realloc(lpmem, numberOfBytes);
#endif // __APPLE__ else

    if (pMem == NULL)
    {
        ERROR("Not enough memory\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }

done:
    LOGEXIT("HeapReAlloc returns LPVOID %p\n", pMem);
    PERF_EXIT(HeapReAlloc);
    return pMem;
}